

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall
wasm::PrintExpressionContents::visitRefFunc(PrintExpressionContents *this,RefFunc *curr)

{
  ostream *o;
  string_view local_28;
  RefFunc *local_18;
  RefFunc *curr_local;
  PrintExpressionContents *this_local;
  
  o = this->o;
  local_18 = curr;
  curr_local = (RefFunc *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28,"ref.func ");
  printMedium(o,local_28);
  wasm::Name::print(&local_18->func,this->o);
  return;
}

Assistant:

void visitRefFunc(RefFunc* curr) {
    printMedium(o, "ref.func ");
    curr->func.print(o);
  }